

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O2

double __thiscall llvm::FileError::log(FileError *this,double __x)

{
  raw_ostream *prVar1;
  unsigned_long *puVar2;
  raw_ostream *in_RSI;
  double extraout_XMM0_Qa;
  
  if (((this->Err)._M_t.
       super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
       super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
       super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl != (ErrorInfoBase *)0x0) &&
     ((this->FileName)._M_string_length != 0)) {
    prVar1 = raw_ostream::operator<<(in_RSI,"\'");
    prVar1 = raw_ostream::operator<<(prVar1,&this->FileName);
    raw_ostream::operator<<(prVar1,"\': ");
    if ((this->Line).Storage.hasVal == true) {
      prVar1 = raw_ostream::operator<<(in_RSI,"line ");
      puVar2 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         (&(this->Line).Storage);
      prVar1 = raw_ostream::operator<<(prVar1,*puVar2);
      raw_ostream::operator<<(prVar1,": ");
    }
    (*((this->Err)._M_t.
       super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
       super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
       super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl)->_vptr_ErrorInfoBase[2])();
    return extraout_XMM0_Qa;
  }
  __assert_fail("Err && !FileName.empty() && \"Trying to log after takeError().\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                ,0x4cc,"virtual void llvm::FileError::log(raw_ostream &) const");
}

Assistant:

void log(raw_ostream &OS) const override {
    assert(Err && !FileName.empty() && "Trying to log after takeError().");
    OS << "'" << FileName << "': ";
    if (Line.hasValue())
      OS << "line " << Line.getValue() << ": ";
    Err->log(OS);
  }